

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::VectorTest_VectorContainingVectors_Test::TestBody
          (VectorTest_VectorContainingVectors_Test *this)

{
  size_t sVar1;
  bool bVar2;
  undefined1 auVar3 [8];
  pointer *__ptr_2;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var4;
  pointer *__ptr;
  char *pcVar5;
  char *in_R9;
  long *plVar6;
  TagAndArray *lhs;
  long *plVar7;
  size_t count;
  undefined1 local_2c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined1 local_2a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  Vector<TagAndArray> local_288;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_270;
  ios_base *local_268;
  TagAndArray *local_260;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_258;
  Vector<unsigned_long> local_250;
  internal local_238 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  Vector<TagAndArray> local_228;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_208;
  TagAndArray *local_200;
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1e8 [7];
  ios_base local_178 [264];
  TagAndArray local_70;
  TagAndArray local_50;
  
  local_228.data_ = (TagAndArray *)0x0;
  local_228.size_ = 0;
  local_228.capacity_ = 0;
  plVar7 = (long *)0x0;
  do {
    local_1f0 = (undefined1  [8])0x0;
    aaStack_1e8[0]._M_allocated_capacity = 0;
    aaStack_1e8[0]._8_8_ = 0;
    local_1f8 = (undefined1  [8])plVar7;
    if (plVar7 == (long *)0x0) {
      auVar3 = (undefined1  [8])(long *)0x0;
    }
    else {
      plVar6 = (long *)0x0;
      do {
        bVar2 = Vector<unsigned_long>::MaybeGrow((Vector<unsigned_long> *)local_1f0);
        if (!bVar2) {
          local_2a8._0_4_ = local_2a8._0_4_ & 0xffffff00;
          local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::Message::Message((Message *)&local_258);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_2c8,(internal *)local_2a8,(AssertionResult *)"elem.vec.Push(j)"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_288,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                     ,0x76,(char *)local_2c8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_288,(Message *)&local_258);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
          if (local_2c8 != (undefined1  [8])&local_2b8) {
            operator_delete((void *)local_2c8,local_2b8._M_allocated_capacity + 1);
          }
          if (local_258._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_258._M_head_impl + 8))();
          }
          if (local_2a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_2a0,local_2a0);
          }
          OPENSSL_free((void *)local_1f0);
          goto LAB_0031570d;
        }
        ((_Alloc_hider *)local_1f0)[aaStack_1e8[0]._M_allocated_capacity]._M_p = (pointer)plVar6;
        aaStack_1e8[0]._0_8_ = aaStack_1e8[0]._M_allocated_capacity + 1;
        plVar6 = (long *)((long)plVar6 + 1);
        auVar3 = local_1f8;
      } while (plVar7 != plVar6);
    }
    local_50.vec.data_ = (unsigned_long *)0x0;
    local_50.vec.size_ = 0;
    local_50.vec.capacity_ = 0;
    local_50.tag = (size_t)auVar3;
    OPENSSL_free((void *)0x0);
    local_50.vec.capacity_ = aaStack_1e8[0]._8_8_;
    local_50.vec.size_ = aaStack_1e8[0]._M_allocated_capacity;
    local_50.vec.data_ = (unsigned_long *)local_1f0;
    local_1f0 = (undefined1  [8])0x0;
    aaStack_1e8[0]._M_allocated_capacity = 0;
    aaStack_1e8[0]._8_8_ = 0;
    bVar2 = Vector<TagAndArray>::Push(&local_228,&local_50);
    local_2a8[0] = (internal)bVar2;
    local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    OPENSSL_free(local_50.vec.data_);
    local_50.vec.data_ = (unsigned_long *)0x0;
    local_50.vec.size_ = 0;
    local_50.vec.capacity_ = 0;
    if (local_2a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_258);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_2c8,(internal *)local_2a8,
                 (AssertionResult *)"vec.Push(std::move(elem))","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_288,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0x78,(char *)local_2c8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)&local_258);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
      if (local_2c8 != (undefined1  [8])&local_2b8) {
        operator_delete((void *)local_2c8,local_2b8._M_allocated_capacity + 1);
      }
      if (local_258._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_258._M_head_impl + 8))();
      }
      if (local_2a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2a0,local_2a0);
      }
      OPENSSL_free((void *)local_1f0);
      goto LAB_0031570d;
    }
    if (local_2a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2a0,local_2a0);
    }
    OPENSSL_free((void *)local_1f0);
    plVar7 = (long *)((long)plVar7 + 1);
  } while (plVar7 != (long *)0x64);
  local_2c8 = (undefined1  [8])local_228.size_;
  local_2a8._0_4_ = 100;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_1f8,"vec.size()","100u",(unsigned_long *)local_2c8,(uint *)local_2a8)
  ;
  if (local_1f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c8);
    if (local_1f0 == (undefined1  [8])0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)local_1f0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x7a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a8,(Message *)local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a8);
    if (local_2c8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_2c8 + 8))();
    }
  }
  if (local_1f0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
  }
  local_250.data_ = (unsigned_long *)0x0;
  local_250.size_ = 0;
  local_250.capacity_ = 0;
  local_258._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4d2;
  bVar2 = Vector<unsigned_long>::MaybeGrow(&local_250);
  if (bVar2) {
    local_250.data_[local_250.size_] = 0x4d2;
    local_250.size_ = local_250.size_ + 1;
    local_70.tag = (size_t)local_258._M_head_impl;
    local_70.vec.data_ = (unsigned_long *)0x0;
    local_70.vec.size_ = 0;
    local_70.vec.capacity_ = 0;
    OPENSSL_free((void *)0x0);
    local_70.vec.capacity_ = local_250.capacity_;
    local_70.vec.size_ = local_250.size_;
    local_70.vec.data_ = local_250.data_;
    local_250.data_ = (unsigned_long *)0x0;
    local_250.size_ = 0;
    local_250.capacity_ = 0;
    bVar2 = Vector<TagAndArray>::Push(&local_228,&local_70);
    local_2c8[0] = (internal)bVar2;
    local_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    OPENSSL_free(local_70.vec.data_);
    local_70.vec.data_ = (unsigned_long *)0x0;
    local_70.vec.size_ = 0;
    local_70.vec.capacity_ = 0;
    if (local_2c8[0] != (internal)0x0) {
      if (local_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2c0,local_2c0);
      }
      sVar1 = local_228.size_;
      local_2c8 = (undefined1  [8])local_228.size_;
      local_2a8._0_4_ = 0x65;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)local_1f8,"vec.size()","101u",(unsigned_long *)local_2c8,
                 (uint *)local_2a8);
      if (local_1f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_2c8);
        if (local_1f0 == (undefined1  [8])0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((_Alloc_hider *)local_1f0)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_2a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                   ,0x81,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_2a8,(Message *)local_2c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a8);
        if (local_2c8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_2c8 + 8))();
        }
      }
      if (local_1f0 != (undefined1  [8])0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0)
        ;
      }
      if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )sVar1 ==
          (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
LAB_0031618b:
        abort();
      }
      local_260 = local_228.data_;
      Vector<unsigned_long>::~Vector(&local_228.data_[sVar1 + -1].vec);
      _Var4._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(sVar1 + -1);
      local_2a8._0_4_ = 100;
      local_2c8 = (undefined1  [8])
                  _Var4._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      local_228.size_ =
           (size_t)_Var4._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)local_1f8,"vec.size()","100u",(unsigned_long *)local_2c8,
                 (uint *)local_2a8);
      if (local_1f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_2c8);
        if (local_1f0 == (undefined1  [8])0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((_Alloc_hider *)local_1f0)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_2a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                   ,0x83,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_2a8,(Message *)local_2c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a8);
        if (local_2c8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_2c8 + 8))();
        }
      }
      if (local_1f0 != (undefined1  [8])0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0)
        ;
      }
      local_288.data_ = (TagAndArray *)0x0;
      local_288.size_ = 0;
      local_288.capacity_ = 0;
      Vector<TagAndArray>::clear(&local_288);
      sVar1 = local_288.capacity_;
      local_228.data_ = local_288.data_;
      local_288.data_ = local_260;
      local_288.capacity_ = local_228.capacity_;
      local_228.size_ = local_288.size_;
      local_228.capacity_ = sVar1;
      local_2a8._0_4_ = 100;
      local_2c8 = (undefined1  [8])
                  _Var4._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      local_288.size_ =
           (size_t)_Var4._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)local_1f8,"vec_moved.size()","100u",(unsigned_long *)local_2c8,
                 (uint *)local_2a8);
      if (local_1f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_2c8);
        if (local_1f0 == (undefined1  [8])0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((_Alloc_hider *)local_1f0)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_2a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                   ,0x86,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_2a8,(Message *)local_2c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a8);
        if (local_2c8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_2c8 + 8))();
        }
      }
      if (local_1f0 != (undefined1  [8])0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0)
        ;
      }
      local_270._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_208._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           _Var4._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )_Var4._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        local_200 = local_260 +
                    (long)_Var4._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
        local_268 = local_178;
        lhs = local_260;
        do {
          if (local_208._M_head_impl <= local_270._M_head_impl) goto LAB_0031618b;
          if (lhs == local_260 + (long)local_270._M_head_impl) {
            testing::AssertionSuccess();
          }
          else {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1f8);
            if (lhs == (TagAndArray *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1f0 + 8),"NULL",4);
            }
            else {
              std::ostream::_M_insert<void_const*>(local_1f0 + 8);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
            std::ios_base::~ios_base(local_268);
            std::__cxx11::stringstream::stringstream((stringstream *)local_1f8);
            if (local_260 == (TagAndArray *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1f0 + 8),"NULL",4);
            }
            else {
              std::ostream::_M_insert<void_const*>(local_1f0 + 8);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
            std::ios_base::~ios_base(local_268);
            testing::internal::EqFailure
                      (local_238,"&elem","&vec_moved[count]",(string *)local_2c8,(string *)local_2a8
                       ,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != &local_298) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_),
                              local_298._M_allocated_capacity + 1);
            }
            if (local_2c8 != (undefined1  [8])&local_2b8) {
              operator_delete((void *)local_2c8,local_2b8._M_allocated_capacity + 1);
            }
          }
          if (local_238[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_1f8);
            pcVar5 = "";
            if (local_230 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = (local_230->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_2c8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0x8a,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_2c8,(Message *)local_1f8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2c8);
            if (local_1f8 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_1f8 + 8))();
            }
          }
          if (local_230 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_230,local_230);
          }
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                    ((internal *)local_1f8,"elem.tag","count",&lhs->tag,(unsigned_long *)&local_270)
          ;
          if (local_1f8[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_2c8);
            pcVar5 = "";
            if (local_1f0 != (undefined1  [8])0x0) {
              pcVar5 = ((_Alloc_hider *)local_1f0)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_2a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0x8c,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_2a8,(Message *)local_2c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a8);
            if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )local_2c8 !=
                (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )0x0) {
              (**(code **)(*(size_type *)local_2c8 + 8))();
            }
          }
          if (local_1f0 != (undefined1  [8])0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_1f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f0);
          }
          local_2c8 = (undefined1  [8])(lhs->vec).size_;
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                    ((internal *)local_1f8,"elem.vec.size()","count",(unsigned_long *)local_2c8,
                     (unsigned_long *)&local_270);
          if (local_1f8[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_2c8);
            pcVar5 = "";
            if (local_1f0 != (undefined1  [8])0x0) {
              pcVar5 = ((_Alloc_hider *)local_1f0)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_2a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0x8d,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_2a8,(Message *)local_2c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a8);
            if (local_2c8 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_2c8 + 8))();
            }
          }
          if (local_1f0 != (undefined1  [8])0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_1f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f0);
          }
          local_2c8 = (undefined1  [8])0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_head_impl ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            local_270._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
          }
          else {
            do {
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (lhs->vec).size_ <= (ulong)local_2c8) goto LAB_0031618b;
              testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                        ((internal *)local_1f8,"elem.vec[j]","j",(lhs->vec).data_ + (long)local_2c8,
                         (unsigned_long *)local_2c8);
              if (local_1f8[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_2a8);
                pcVar5 = "";
                if (local_1f0 != (undefined1  [8])0x0) {
                  pcVar5 = ((_Alloc_hider *)local_1f0)->_M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_238,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                           ,0x8f,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_238,(Message *)local_2a8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_238);
                if ((long *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) + 8))();
                }
              }
              if (local_1f0 != (undefined1  [8])0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_1f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1f0);
              }
              local_2c8 = (undefined1  [8])((long)local_2c8 + 1);
            } while ((ulong)local_2c8 < local_270._M_head_impl);
            local_270._M_head_impl = local_270._M_head_impl + 1;
          }
          lhs = lhs + 1;
        } while (lhs != local_200);
      }
      Vector<TagAndArray>::clear(&local_288);
      goto LAB_0031617c;
    }
    testing::Message::Message((Message *)local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f8,(internal *)local_2c8,
               (AssertionResult *)"vec.Push(std::move(extra))","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_288,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x80,(char *)local_1f8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)local_2a8);
  }
  else {
    local_2c8 = (undefined1  [8])((ulong)local_2c8 & 0xffffffffffffff00);
    local_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f8,(internal *)local_2c8,(AssertionResult *)"extra.vec.Push(1234)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_288,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x7f,(char *)local_1f8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)local_2a8);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
  if (local_1f8 != (undefined1  [8])(local_1f0 + 8)) {
    operator_delete((void *)local_1f8,aaStack_1e8[0]._M_allocated_capacity + 1);
  }
  if ((long *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_) + 8))();
  }
  if (local_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c0,local_2c0);
  }
LAB_0031617c:
  OPENSSL_free(local_250.data_);
LAB_0031570d:
  Vector<TagAndArray>::clear(&local_228);
  return;
}

Assistant:

TEST(InplaceVectorTest, ComplexType) {
  InplaceVector<std::vector<int>, 4> vec_of_vecs;
  const std::vector<int> data[] = {{1, 2, 3}, {4, 5, 6}, {7, 8, 9}};
  vec_of_vecs.CopyFrom(data);
  EXPECT_EQ(Span(vec_of_vecs), Span(data));

  vec_of_vecs.Resize(2);
  EXPECT_EQ(Span(vec_of_vecs), Span(data, 2));

  vec_of_vecs.PushBack({42});
  EXPECT_EQ(3u, vec_of_vecs.size());
  vec_of_vecs.pop_back();
  EXPECT_EQ(2u, vec_of_vecs.size());

  vec_of_vecs.Resize(4);
  EXPECT_EQ(4u, vec_of_vecs.size());
  EXPECT_EQ(vec_of_vecs[0], data[0]);
  EXPECT_EQ(vec_of_vecs[1], data[1]);
  EXPECT_TRUE(vec_of_vecs[2].empty());
  EXPECT_TRUE(vec_of_vecs[3].empty());

  // Copy-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs2 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs2.size());
  EXPECT_EQ(vec_of_vecs2[0], data[0]);
  EXPECT_EQ(vec_of_vecs2[1], data[1]);
  EXPECT_TRUE(vec_of_vecs2[2].empty());
  EXPECT_TRUE(vec_of_vecs2[3].empty());

  // Copy-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs3;
  vec_of_vecs3 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs3.size());
  EXPECT_EQ(vec_of_vecs3[0], data[0]);
  EXPECT_EQ(vec_of_vecs3[1], data[1]);
  EXPECT_TRUE(vec_of_vecs3[2].empty());
  EXPECT_TRUE(vec_of_vecs3[3].empty());

  // Move-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs4 = std::move(vec_of_vecs);
  EXPECT_EQ(4u, vec_of_vecs4.size());
  EXPECT_EQ(vec_of_vecs4[0], data[0]);
  EXPECT_EQ(vec_of_vecs4[1], data[1]);
  EXPECT_TRUE(vec_of_vecs4[2].empty());
  EXPECT_TRUE(vec_of_vecs4[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs.size());
  for (const auto &vec : vec_of_vecs) {
    EXPECT_TRUE(vec.empty());
  }

  // Move-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs5;
  vec_of_vecs5 = std::move(vec_of_vecs4);
  EXPECT_EQ(4u, vec_of_vecs5.size());
  EXPECT_EQ(vec_of_vecs5[0], data[0]);
  EXPECT_EQ(vec_of_vecs5[1], data[1]);
  EXPECT_TRUE(vec_of_vecs5[2].empty());
  EXPECT_TRUE(vec_of_vecs5[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs4.size());
  for (const auto &vec : vec_of_vecs4) {
    EXPECT_TRUE(vec.empty());
  }

  std::vector<int> v = {42};
  vec_of_vecs5.Resize(3);
  EXPECT_TRUE(vec_of_vecs5.TryPushBack(v));
  EXPECT_EQ(v, vec_of_vecs5[3]);
  EXPECT_FALSE(vec_of_vecs5.TryPushBack(v));
}